

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int aead_do_encrypt(ptls_aead_context_t *_ctx,void *_output,size_t *outlen,void *input,size_t inlen,
                   void *iv,uint8_t enc_content_type)

{
  int iVar1;
  int local_54;
  uchar *puStack_50;
  int blocklen;
  uint8_t *output;
  aead_crypto_context_t *ctx;
  void *iv_local;
  size_t inlen_local;
  void *input_local;
  size_t *outlen_local;
  void *_output_local;
  ptls_aead_context_t *_ctx_local;
  
  *outlen = 0;
  puStack_50 = (uchar *)_output;
  output = (uint8_t *)_ctx;
  ctx = (aead_crypto_context_t *)iv;
  iv_local = (void *)inlen;
  inlen_local = (size_t)input;
  input_local = outlen;
  outlen_local = (size_t *)_output;
  _output_local = _ctx;
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                             (uchar *)0x0,(uchar *)iv);
  if (iVar1 == 0) {
    _ctx_local._4_4_ = 0x203;
  }
  else {
    iVar1 = EVP_EncryptUpdate(*(EVP_CIPHER_CTX **)(output + 0x30),puStack_50,&local_54,
                              (uchar *)inlen_local,(int)iv_local);
    if (iVar1 == 0) {
      _ctx_local._4_4_ = 0x203;
    }
    else {
      *(long *)input_local = (long)local_54 + *input_local;
      iVar1 = EVP_EncryptUpdate(*(EVP_CIPHER_CTX **)(output + 0x30),puStack_50 + *input_local,
                                &local_54,&enc_content_type,1);
      if (iVar1 == 0) {
        _ctx_local._4_4_ = 0x203;
      }
      else {
        *(long *)input_local = (long)local_54 + *input_local;
        iVar1 = EVP_EncryptFinal_ex(*(EVP_CIPHER_CTX **)(output + 0x30),puStack_50 + *input_local,
                                    &local_54);
        if (iVar1 == 0) {
          _ctx_local._4_4_ = 0x203;
        }
        else {
          *(long *)input_local = (long)local_54 + *input_local;
          iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)(output + 0x30),0x10,
                                      (int)*(undefined8 *)(output + 0x38),puStack_50 + *input_local)
          ;
          if (iVar1 == 0) {
            _ctx_local._4_4_ = 0x203;
          }
          else {
            *(long *)input_local = *(long *)(output + 0x38) + *input_local;
            _ctx_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return _ctx_local._4_4_;
}

Assistant:

static int aead_do_encrypt(ptls_aead_context_t *_ctx, void *_output, size_t *outlen, const void *input, size_t inlen,
                           const void *iv, uint8_t enc_content_type)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output;
    int blocklen;

    *outlen = 0;

    /* FIXME for performance, preserve the expanded key instead of the raw key */
    if (!EVP_EncryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv))
        return PTLS_ERROR_LIBRARY;
    if (!EVP_EncryptUpdate(ctx->evp_ctx, output, &blocklen, input, (int)inlen))
        return PTLS_ERROR_LIBRARY;
    *outlen += blocklen;
    if (!EVP_EncryptUpdate(ctx->evp_ctx, output + *outlen, &blocklen, &enc_content_type, 1))
        return PTLS_ERROR_LIBRARY;
    *outlen += blocklen;
    if (!EVP_EncryptFinal_ex(ctx->evp_ctx, output + *outlen, &blocklen))
        return PTLS_ERROR_LIBRARY;
    *outlen += blocklen;
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_GET_TAG, (int)ctx->tag_size, output + *outlen))
        return PTLS_ERROR_LIBRARY;
    *outlen += ctx->tag_size;

    return 0;
}